

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugNonbasicMove(HEkk *this,HighsLp *pass_lp)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  int *in_RSI;
  long in_RDI;
  HighsInt num_errors;
  HighsInt iRow_1;
  HighsInt iRow;
  HighsInt iVar;
  double upper;
  double lower;
  bool right_size;
  HighsInt numTot;
  bool use_pass_lp;
  HighsInt num_row;
  HighsInt num_col;
  HighsInt num_fixed_variable_move_errors;
  HighsInt num_boxed_variable_move_errors;
  HighsInt num_upper_bounded_variable_move_errors;
  HighsInt num_lower_bounded_variable_move_errors;
  HighsInt num_free_variable_move_errors;
  SimplexBasis *basis;
  HighsOptions *options;
  HighsDebugStatus return_status;
  int local_6c;
  double local_68;
  double local_60;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  HighsDebugStatus local_1c;
  HighsDebugStatus local_4;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 2) {
    local_4 = kNotChecked;
  }
  else {
    local_1c = kOk;
    lVar1 = *(long *)(in_RDI + 8);
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    if (in_RSI == (int *)0x0) {
      local_48 = *(int *)(in_RDI + 0x2198);
      local_4c = *(int *)(in_RDI + 0x219c);
    }
    else {
      local_48 = *in_RSI;
      local_4c = in_RSI[1];
    }
    sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x29a8));
    if ((int)sVar4 != local_48 + local_4c) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,"nonbasicMove size error\n");
      local_1c = kLogicalError;
    }
    for (local_6c = 0; local_6c < local_48 + local_4c; local_6c = local_6c + 1) {
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                          (long)local_6c);
      if (*pvVar5 != '\0') {
        if (in_RSI == (int *)0x0) {
          if (local_6c < local_48) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21b8),
                                (long)local_6c);
            local_60 = *pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21d0),
                                (long)local_6c);
            local_68 = *pvVar6;
          }
          else {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2200),
                                (long)(local_6c - local_48));
            local_60 = -*pvVar6;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21e8),
                                (long)(local_6c - local_48));
            local_68 = -*pvVar6;
          }
        }
        else if (local_6c < local_48) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)local_6c
                             );
          local_60 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),
                              (long)local_6c);
          local_68 = *pvVar6;
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x1a),
                              (long)(local_6c - local_48));
          local_60 = -*pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x14),
                              (long)(local_6c - local_48));
          local_68 = -*pvVar6;
        }
        bVar2 = highs_isInfinity(local_68);
        if (bVar2) {
          bVar2 = highs_isInfinity(-local_60);
          if (bVar2) {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_6c);
            if (*pvVar5 != '\0') {
              local_34 = local_34 + 1;
            }
          }
          else {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_6c);
            if (*pvVar5 != '\x01') {
              local_38 = local_38 + 1;
            }
          }
        }
        else {
          bVar2 = highs_isInfinity(-local_60);
          if (bVar2) {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_6c);
            if (*pvVar5 != -1) {
              local_3c = local_3c + 1;
            }
          }
          else if ((local_60 != local_68) || (NAN(local_60) || NAN(local_68))) {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_6c);
            if (*pvVar5 == '\0') {
              local_40 = local_40 + 1;
            }
          }
          else {
            pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                (in_RDI + 0x29a8),(long)local_6c);
            if (*pvVar5 != '\0') {
              local_44 = local_44 + 1;
            }
          }
        }
      }
    }
    uVar3 = local_34 + local_38 + local_3c + local_40 + local_44;
    if (uVar3 != 0) {
      highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                  "There are %d nonbasicMove errors: %d free; %d lower; %d upper; %d boxed; %d fixed\n"
                  ,(ulong)uVar3,(ulong)local_34,(ulong)local_38,local_3c,local_40,local_44);
      local_1c = kLogicalError;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicMove(const HighsLp* pass_lp) const {
  // Non-trivially expensive check of NonbasicMove
  if (this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const SimplexBasis& basis = this->basis_;
  HighsInt num_free_variable_move_errors = 0;
  HighsInt num_lower_bounded_variable_move_errors = 0;
  HighsInt num_upper_bounded_variable_move_errors = 0;
  HighsInt num_boxed_variable_move_errors = 0;
  HighsInt num_fixed_variable_move_errors = 0;
  HighsInt num_col;
  HighsInt num_row;
  const bool use_pass_lp = (pass_lp != nullptr);
  if (use_pass_lp) {
    num_col = pass_lp->num_col_;
    num_row = pass_lp->num_row_;
  } else {
    assert(1 == 0);
    num_col = this->lp_.num_col_;
    num_row = this->lp_.num_row_;
  }

  const HighsInt numTot = num_col + num_row;
  bool right_size = (HighsInt)basis.nonbasicMove_.size() == numTot;
  // Check consistency of nonbasicMove
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicMove size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  double lower;
  double upper;

  for (HighsInt iVar = 0; iVar < numTot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    // Nonbasic variable
    if (use_pass_lp) {
      if (iVar < num_col) {
        lower = pass_lp->col_lower_[iVar];
        upper = pass_lp->col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - num_col;
        lower = -pass_lp->row_upper_[iRow];
        upper = -pass_lp->row_lower_[iRow];
      }
    } else {
      if (iVar < num_col) {
        lower = this->lp_.col_lower_[iVar];
        upper = this->lp_.col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - num_col;
        lower = -this->lp_.row_upper_[iRow];
        upper = -this->lp_.row_lower_[iRow];
      }
    }

    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free
        if (basis.nonbasicMove_[iVar]) {
          num_free_variable_move_errors++;
        }
      } else {
        // Only lower bounded
        if (basis.nonbasicMove_[iVar] != kNonbasicMoveUp) {
          num_lower_bounded_variable_move_errors++;
        }
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded
        if (basis.nonbasicMove_[iVar] != kNonbasicMoveDn) {
          num_upper_bounded_variable_move_errors++;
        }
      } else {
        // Boxed or fixed
        if (lower != upper) {
          // Boxed
          if (!basis.nonbasicMove_[iVar]) {
            num_boxed_variable_move_errors++;
          }
        } else {
          // Fixed
          if (basis.nonbasicMove_[iVar]) {
            num_fixed_variable_move_errors++;
          }
        }
      }
    }
  }
  HighsInt num_errors =
      num_free_variable_move_errors + num_lower_bounded_variable_move_errors +
      num_upper_bounded_variable_move_errors + num_boxed_variable_move_errors +
      num_fixed_variable_move_errors;

  if (num_errors) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "There are %" HIGHSINT_FORMAT
                " nonbasicMove errors: %" HIGHSINT_FORMAT
                " free; %" HIGHSINT_FORMAT " lower; %" HIGHSINT_FORMAT
                " upper; %" HIGHSINT_FORMAT
                " "
                "boxed; %" HIGHSINT_FORMAT " fixed\n",
                num_errors, num_free_variable_move_errors,
                num_lower_bounded_variable_move_errors,
                num_upper_bounded_variable_move_errors,
                num_boxed_variable_move_errors, num_fixed_variable_move_errors);
    assert(num_errors == 0);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}